

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

unsigned_short tcu::(anonymous_namespace)::convertSat<unsigned_short,int>(int src)

{
  unsigned_short uVar1;
  int max;
  int min;
  int src_local;
  
  min._2_2_ = std::numeric_limits<unsigned_short>::min();
  uVar1 = std::numeric_limits<unsigned_short>::max();
  if (((int)(uint)min._2_2_ <= src) && (min._2_2_ = uVar1, src <= (int)(uint)uVar1)) {
    min._2_2_ = (unsigned_short)src;
  }
  return min._2_2_;
}

Assistant:

static inline T convertSat (S src)
{
	S min = (S)std::numeric_limits<T>::min();
	S max = (S)std::numeric_limits<T>::max();

	if (src < min)
		return (T)min;
	else if (src > max)
		return (T)max;
	else
		return (T)src;
}